

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void anon_unknown.dwarf_13fc48::ReadChannelInfo
               (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                *channels,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  bool bVar1;
  char *pcVar2;
  undefined1 local_50 [8];
  ChannelInfo info;
  char *p;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  *channels_local;
  
  info._40_8_ = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,0);
  while (*(char *)info._40_8_ != '\0') {
    anon_struct_48_5_91bcb76e::ChannelInfo((anon_struct_48_5_91bcb76e *)local_50);
    pcVar2 = ReadString((string *)local_50,(char *)info._40_8_);
    info.name.field_2._8_4_ = *(undefined4 *)pcVar2;
    info.name.field_2._M_local_buf[0xc] = pcVar2[4];
    info.pixelType = *(int *)(pcVar2 + 8);
    info.pLinear = pcVar2[0xc];
    info._37_1_ = pcVar2[0xd];
    info._38_1_ = pcVar2[0xe];
    info._39_1_ = pcVar2[0xf];
    info._40_8_ = pcVar2 + 0x10;
    bVar1 = IsBigEndian();
    if (bVar1) {
      swap4((uint *)(info.name.field_2._M_local_buf + 8));
      swap4((uint *)&info.pixelType);
      swap4((uint *)&info.pLinear);
    }
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::push_back(channels,(value_type *)local_50);
    anon_struct_48_5_91bcb76e::~ChannelInfo((anon_struct_48_5_91bcb76e *)local_50);
  }
  return;
}

Assistant:

void ReadChannelInfo(std::vector<ChannelInfo> &channels,
                     const std::vector<unsigned char> &data) {
  const char *p = reinterpret_cast<const char *>(&data.at(0));

  for (;;) {
    if ((*p) == 0) {
      break;
    }
    ChannelInfo info;
    p = ReadString(info.name, p);

    memcpy(&info.pixelType, p, sizeof(int));
    p += 4;
    info.pLinear = p[0];                     // uchar
    p += 1 + 3;                              // reserved: uchar[3]
    memcpy(&info.xSampling, p, sizeof(int)); // int
    p += 4;
    memcpy(&info.ySampling, p, sizeof(int)); // int
    p += 4;

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&info.pixelType));
      swap4(reinterpret_cast<unsigned int *>(&info.xSampling));
      swap4(reinterpret_cast<unsigned int *>(&info.ySampling));
    }

    channels.push_back(info);
  }
}